

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O2

void __thiscall t_cl_generator::package_def(t_cl_generator *this,ostream *out)

{
  t_program *ptVar1;
  pointer pptVar2;
  ostream *poVar3;
  pointer pptVar4;
  string sStack_48;
  
  ptVar1 = (this->super_t_oop_generator).super_t_generator.program_;
  poVar3 = std::operator<<(out,"(thrift:def-package :");
  package_abi_cxx11_(&sStack_48,this);
  std::operator<<(poVar3,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if ((ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::operator<<(out," :use (");
    pptVar2 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pptVar4 = (ptVar1->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pptVar4 != pptVar2;
        pptVar4 = pptVar4 + 1) {
      ptVar1 = *pptVar4;
      poVar3 = std::operator<<(out," :");
      std::operator<<(poVar3,(string *)&ptVar1->name_);
    }
    std::operator<<(out,")");
  }
  poVar3 = std::operator<<(out,")");
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void t_cl_generator::package_def(std::ostream &out) {
  const vector<t_program*>& includes = program_->get_includes();

  out << "(thrift:def-package :" << package();
  if ( includes.size() > 0 ) {
    out << " :use (";
    for (auto include : includes) {
      out << " :" << include->get_name();
    }
    out << ")";
  }
  out << ")" << endl << endl;
}